

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_test.cc
# Opt level: O3

void __thiscall
leveldb::anon_unknown_0::ReverseKeyComparator::FindShortestSeparator
          (ReverseKeyComparator *this,string *start,Slice *limit)

{
  Comparator *pCVar1;
  string s;
  string l;
  undefined1 local_70 [32];
  string local_50;
  string local_30;
  
  Reverse_abi_cxx11_((string *)local_70,(leveldb *)(start->_M_dataplus)._M_p,
                     (Slice *)start->_M_string_length);
  Reverse_abi_cxx11_(&local_30,(leveldb *)limit->data_,(Slice *)limit->size_);
  pCVar1 = BytewiseComparator();
  local_50._M_dataplus._M_p._0_4_ = local_30._M_dataplus._M_p._0_4_;
  local_50._M_dataplus._M_p._4_4_ = local_30._M_dataplus._M_p._4_4_;
  local_50._M_string_length._0_4_ = (undefined4)local_30._M_string_length;
  local_50._M_string_length._4_4_ = local_30._M_string_length._4_4_;
  (*pCVar1->_vptr_Comparator[4])(pCVar1,local_70);
  Reverse_abi_cxx11_(&local_50,(leveldb *)local_70._0_8_,(Slice *)local_70._8_8_);
  std::__cxx11::string::operator=((string *)start,(string *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_50._M_dataplus._M_p._4_4_,local_50._M_dataplus._M_p._0_4_) !=
      &local_50.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_50._M_dataplus._M_p._4_4_,local_50._M_dataplus._M_p._0_4_));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_30._M_dataplus._M_p._4_4_,local_30._M_dataplus._M_p._0_4_) !=
      &local_30.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_30._M_dataplus._M_p._4_4_,local_30._M_dataplus._M_p._0_4_));
  }
  if ((leveldb *)local_70._0_8_ != (leveldb *)(local_70 + 0x10)) {
    operator_delete((void *)local_70._0_8_);
  }
  return;
}

Assistant:

void FindShortestSeparator(std::string* start,
                             const Slice& limit) const override {
    std::string s = Reverse(*start);
    std::string l = Reverse(limit);
    BytewiseComparator()->FindShortestSeparator(&s, l);
    *start = Reverse(s);
  }